

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

WebPChunk * ChunkSearchList(WebPChunk *first,uint32_t nth,uint32_t tag)

{
  WebPChunk *pWVar1;
  WebPChunk *pWVar2;
  uint32_t uVar3;
  
  pWVar1 = ChunkSearchNextInList(first,tag);
  uVar3 = nth;
  if (pWVar1 == (WebPChunk *)0x0) {
    pWVar1 = (WebPChunk *)0x0;
  }
  else {
    do {
      pWVar2 = pWVar1;
      uVar3 = uVar3 - 1;
      if (uVar3 == 0) break;
      pWVar1 = ChunkSearchNextInList(pWVar2->next_,tag);
    } while (pWVar1 != (WebPChunk *)0x0);
    pWVar1 = (WebPChunk *)0x0;
    if (uVar3 == 0) {
      pWVar1 = pWVar2;
    }
    if (nth == 0) {
      pWVar1 = pWVar2;
    }
  }
  return pWVar1;
}

Assistant:

WebPChunk* ChunkSearchList(WebPChunk* first, uint32_t nth, uint32_t tag) {
  uint32_t iter = nth;
  first = ChunkSearchNextInList(first, tag);
  if (first == NULL) return NULL;

  while (--iter != 0) {
    WebPChunk* next_chunk = ChunkSearchNextInList(first->next_, tag);
    if (next_chunk == NULL) break;
    first = next_chunk;
  }
  return ((nth > 0) && (iter > 0)) ? NULL : first;
}